

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

int __thiscall
QTableViewPrivate::nextActiveVisualColumn
          (QTableViewPrivate *this,int row,int columnToStart,int limit,
          SearchDirection searchDirection)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int in_ECX;
  int in_EDX;
  QTableViewPrivate *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int visualColumn;
  int lr;
  anon_class_8_1_8991fb9c isCellActive;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc8;
  int iVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = logicalRow(in_RDI,in_stack_ffffffffffffffbc);
  if (in_R8D == 0) {
    iVar5 = 0;
    while( true ) {
      bVar2 = 0;
      if (in_EDX < in_ECX) {
        bVar3 = nextActiveVisualColumn::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)CONCAT44(iVar4,in_EDX),iVar5,
                           in_stack_ffffffffffffffc8);
        bVar2 = bVar3 ^ 0xff;
      }
      if ((bVar2 & 1) == 0) break;
      in_EDX = in_EDX + 1;
    }
  }
  else if (in_R8D == 1) {
    iVar5 = 1;
    while( true ) {
      bVar2 = 0;
      if (in_ECX < in_EDX) {
        bVar3 = nextActiveVisualColumn::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)CONCAT44(iVar4,in_EDX),iVar5,
                           in_stack_ffffffffffffffc8);
        bVar2 = bVar3 ^ 0xff;
      }
      if ((bVar2 & 1) == 0) break;
      in_EDX = in_EDX + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_EDX;
}

Assistant:

int QTableViewPrivate::nextActiveVisualColumn(int row, int columnToStart, int limit,
                                              SearchDirection searchDirection) const
{
    const int lr = logicalRow(row);
    int visualColumn = columnToStart;
    const auto isCellActive = [this](int lr, int vc)
    {
        const int lc = logicalColumn(vc);
        return !isColumnHidden(lc) && isCellEnabled(lr, lc);
    };
    switch (searchDirection) {
    case SearchDirection::Increasing:
        while (visualColumn < limit && !isCellActive(lr, visualColumn))
            ++visualColumn;
        break;
    case SearchDirection::Decreasing:
        while (visualColumn > limit && !isCellActive(lr, visualColumn))
            --visualColumn;
        break;
    }
    return visualColumn;
}